

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_STDDEV.c
# Opt level: O2

void TA_INT_stddev_using_precalc_ma
               (double *inReal,double *inMovAvg,int inMovAvgBegIdx,int inMovAvgNbElement,
               int timePeriod,double *output)

{
  double dVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double __x;
  double dVar6;
  double dVar7;
  
  dVar7 = 0.0;
  lVar2 = (long)((inMovAvgBegIdx - timePeriod) + 1);
  for (lVar3 = lVar2; lVar3 < inMovAvgBegIdx; lVar3 = lVar3 + 1) {
    dVar7 = dVar7 + inReal[lVar3] * inReal[lVar3];
  }
  uVar4 = 0;
  uVar5 = (ulong)(uint)inMovAvgNbElement;
  if (inMovAvgNbElement < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    dVar7 = dVar7 + inReal[(long)inMovAvgBegIdx + uVar4] * inReal[(long)inMovAvgBegIdx + uVar4];
    dVar1 = inReal[lVar2 + uVar4];
    __x = dVar7 / (double)timePeriod - inMovAvg[uVar4] * inMovAvg[uVar4];
    dVar6 = 0.0;
    if (1e-14 <= __x) {
      if (__x < 0.0) {
        dVar6 = sqrt(__x);
      }
      else {
        dVar6 = SQRT(__x);
      }
    }
    dVar7 = dVar7 - dVar1 * dVar1;
    output[uVar4] = dVar6;
  }
  return;
}

Assistant:

void TA_PREFIX(INT_stddev_using_precalc_ma)( const INPUT_TYPE *inReal,
                                             const double *inMovAvg,
                                             int inMovAvgBegIdx,
                                             int inMovAvgNbElement,
                                             int timePeriod,
                                             double *output )
#endif
{
   double tempReal, periodTotal2, meanValue2;
   int outIdx;

   /* Start/end index for sumation. */
   int startSum, endSum;

   startSum = 1+inMovAvgBegIdx-timePeriod;
   endSum = inMovAvgBegIdx;

   periodTotal2 = 0;

   for( outIdx = startSum; outIdx < endSum; outIdx++)
   {
      tempReal = inReal[outIdx];
      tempReal *= tempReal;
      periodTotal2 += tempReal;
   }

   for( outIdx=0; outIdx < inMovAvgNbElement; outIdx++, startSum++, endSum++ )
   {
      tempReal = inReal[endSum];
      tempReal *= tempReal;
      periodTotal2 += tempReal;
      meanValue2 = periodTotal2/timePeriod;

      tempReal = inReal[startSum];
      tempReal *= tempReal;
      periodTotal2 -= tempReal;

      tempReal = inMovAvg[outIdx];
      tempReal *= tempReal;
      meanValue2 -= tempReal;

      if( !TA_IS_ZERO_OR_NEG(meanValue2) )
         output[outIdx] = std_sqrt(meanValue2);
      else
         output[outIdx] = (double)0.0;
   }
}